

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcConfigListWGL.cpp
# Opt level: O0

void glcts::getConfigListWGL(Platform *param_1,ApiType param_2,ConfigList *param_3)

{
  Exception *this;
  allocator<char> local_41;
  string local_40;
  ConfigList *local_20;
  ConfigList *param_2_local;
  Platform *param_0_local;
  ApiType param_1_local;
  
  local_20 = param_3;
  param_2_local = (ConfigList *)param_1;
  param_0_local._4_4_ = param_2.m_bits;
  this = (Exception *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"WGL is not supported on this OS",&local_41);
  tcu::Exception::Exception(this,&local_40);
  __cxa_throw(this,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void getConfigListWGL(tcu::Platform&, glu::ApiType, ConfigList&)
{
	throw tcu::Exception("WGL is not supported on this OS");
}